

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

void render_open_td_block(MD_HTML *r,MD_CHAR *cell_type,MD_BLOCK_TD_DETAIL *det)

{
  int iVar1;
  int *in_RDX;
  char *in_RSI;
  MD_HTML *in_RDI;
  MD_CHAR *in_stack_ffffffffffffffc8;
  MD_HTML *in_stack_ffffffffffffffd0;
  
  render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  strlen(in_RSI);
  render_verbatim(in_RDI,in_stack_ffffffffffffffc8,0);
  iVar1 = *in_RDX;
  if (iVar1 == 1) {
    render_verbatim(in_RDI,in_stack_ffffffffffffffc8,0);
  }
  else if (iVar1 == 2) {
    render_verbatim(in_RDI,in_stack_ffffffffffffffc8,0);
  }
  else if (iVar1 == 3) {
    render_verbatim(in_RDI,in_stack_ffffffffffffffc8,0);
  }
  else {
    render_verbatim(in_RDI,in_stack_ffffffffffffffc8,0);
  }
  return;
}

Assistant:

static void
render_open_td_block(MD_HTML* r, const MD_CHAR* cell_type, const MD_BLOCK_TD_DETAIL* det)
{
    RENDER_VERBATIM(r, "<");
    RENDER_VERBATIM(r, cell_type);

    switch(det->align) {
        case MD_ALIGN_LEFT:     RENDER_VERBATIM(r, " align=\"left\">"); break;
        case MD_ALIGN_CENTER:   RENDER_VERBATIM(r, " align=\"center\">"); break;
        case MD_ALIGN_RIGHT:    RENDER_VERBATIM(r, " align=\"right\">"); break;
        default:                RENDER_VERBATIM(r, ">"); break;
    }
}